

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O1

PCRE2_SPTR16 get_chr_property_list(PCRE2_SPTR16 code,BOOL utf,uint8_t *fcc,uint32_t *list)

{
  ushort *puVar1;
  uint uVar2;
  ulong uVar3;
  ushort *puVar4;
  undefined4 in_register_00000034;
  uint uVar5;
  ushort uVar6;
  
  uVar6 = *code;
  *(uint *)fcc = (uint)uVar6;
  fcc[4] = '\0';
  fcc[5] = '\0';
  fcc[6] = '\0';
  fcc[7] = '\0';
  puVar1 = code + 1;
  if ((ushort)(uVar6 - 0x21) < 0x41) {
    uVar5 = (uint)uVar6;
    if ((((uVar6 < 0x62) && (uVar5 = 0x55, uVar6 < 0x55)) && (uVar5 = 0x48, uVar6 < 0x48)) &&
       ((uVar5 = 0x3b, uVar6 < 0x3b && (uVar5 = 0x2e, uVar6 < 0x2e)))) {
      uVar5 = 0x21;
    }
    uVar2 = (uVar6 - uVar5) + 0x21;
    uVar3 = (ulong)(uVar2 & 0xffff);
    uVar6 = (ushort)uVar2;
    if ((uVar6 < 0x2e) && ((0x238000000000U >> (uVar3 & 0x3f) & 1) != 0)) {
      puVar1 = code + 2;
    }
    if ((0x29 < uVar6) || (uVar2 = 0, (0x21800000000U >> (uVar3 & 0x3f) & 1) == 0)) {
      uVar2 = (uint)(uVar6 != 0x2b);
    }
    *(uint *)(fcc + 4) = uVar2;
    if (uVar5 < 0x3b) {
      if (uVar5 == 0x21) {
        fcc[0] = '\x1d';
        fcc[1] = '\0';
        fcc[2] = '\0';
        fcc[3] = '\0';
      }
      else if (uVar5 == 0x2e) {
        fcc[0] = '\x1e';
        fcc[1] = '\0';
        fcc[2] = '\0';
        fcc[3] = '\0';
      }
    }
    else if (uVar5 == 0x3b) {
      fcc[0] = '\x1f';
      fcc[1] = '\0';
      fcc[2] = '\0';
      fcc[3] = '\0';
    }
    else if (uVar5 == 0x48) {
      fcc[0] = ' ';
      fcc[1] = '\0';
      fcc[2] = '\0';
      fcc[3] = '\0';
    }
    else if (uVar5 == 0x55) {
      *(uint *)fcc = (uint)*puVar1;
      puVar1 = puVar1 + 1;
    }
    uVar6 = *(ushort *)fcc;
  }
  uVar3 = (ulong)uVar6;
  if (uVar6 < 0x21) {
    if ((0x7fe3fc0UL >> (uVar3 & 0x3f) & 1) != 0) {
      return puVar1;
    }
    if ((0xa0000000UL >> (uVar3 & 0x3f) & 1) != 0) {
      *(uint *)(fcc + 8) = (uint)*puVar1;
LAB_0013b195:
      fcc[0xc] = 0xff;
      fcc[0xd] = 0xff;
      fcc[0xe] = 0xff;
      fcc[0xf] = 0xff;
      return puVar1 + 1;
    }
    if ((0x140000000U >> (uVar3 & 0x3f) & 1) != 0) {
      *(uint *)fcc = (uVar6 != 0x1e) + 0x1d + (uint)(uVar6 != 0x1e);
      uVar6 = *puVar1;
      uVar5 = (uint)uVar6;
      *(uint *)(fcc + 8) = uVar5;
      uVar2 = (uint)uVar6;
      if (uVar2 < 0x100) {
        uVar5 = (uint)*(byte *)(CONCAT44(in_register_00000034,utf) + (ulong)uVar2);
      }
      *(uint *)(fcc + 0xc) = uVar5;
      if (uVar5 != uVar2) {
        fcc[0x10] = 0xff;
        fcc[0x11] = 0xff;
        fcc[0x12] = 0xff;
        fcc[0x13] = 0xff;
        return puVar1 + 1;
      }
      goto LAB_0013b195;
    }
  }
  if (uVar6 - 0x6e < 2) {
    puVar4 = puVar1 + 0x10;
  }
  else {
    if (uVar6 != 0x70) {
      return (PCRE2_SPTR16)0x0;
    }
    puVar4 = puVar1 + ((ulong)*puVar1 - 1);
  }
  uVar5 = *puVar4 - 0x62;
  if (uVar5 < 0xc) {
    if ((0x533U >> (uVar5 & 0x1f) & 1) == 0) {
      if ((0x20cU >> (uVar5 & 0x1f) & 1) == 0) {
        *(uint *)(fcc + 4) = (uint)(puVar4[1] == 0);
        puVar4 = puVar4 + 3;
        goto LAB_0013b1f0;
      }
    }
    else {
      fcc[4] = '\x01';
      fcc[5] = '\0';
      fcc[6] = '\0';
      fcc[7] = '\0';
    }
    puVar4 = puVar4 + 1;
  }
LAB_0013b1f0:
  *(int *)(fcc + 8) = (int)((ulong)((long)puVar4 - (long)puVar1) >> 1);
  return puVar4;
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warning */
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }
return NULL;    /* Opcode not accepted */
}